

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-entity.cpp
# Opt level: O2

void __thiscall constructor::test_method(constructor *this)

{
  string *psVar1;
  Entity *this_00;
  string *psVar2;
  undefined8 uVar3;
  allocator<char> local_132;
  allocator<char> local_131;
  undefined **local_130;
  undefined1 local_128;
  undefined8 *local_120;
  char *local_118;
  string local_110 [32];
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x25);
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0010abb8;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
            (&local_130,&local_60,0x25,1,2,&CustomEntity::CLASS_NAME_abi_cxx11_,
             "CustomEntity::CLASS_NAME","CustomEntity","\"CustomEntity\"");
  psVar1 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"CustomEntity",&local_131)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_110,"my-entity",&local_132);
  this_00 = (Entity *)dynamicgraph::FactoryStorage::newEntity(psVar1,(string *)&local_130);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string((string *)&local_130);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x2a);
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0010abb8;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (&local_130,&local_90,0x2a,1,2,this_00 + 8,"entity->getName()","my-entity",
             "\"my-entity\"");
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x2b);
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0010abb8;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_b8 = "";
  psVar2 = dynamicgraph::Entity::getClassName_abi_cxx11_(this_00);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (&local_130,&local_c0,0x2b,1,2,psVar2,"entity->Entity::getClassName()","Entity",
             "\"Entity\"");
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x2c);
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0010abb8;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_e8 = "";
  uVar3 = (**(code **)(*(long *)this_00 + 0x10))(this_00);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_130,&local_f0,0x2c,1,2,uVar3,"entity->getClassName()",
             &CustomEntity::CLASS_NAME_abi_cxx11_,"CustomEntity::CLASS_NAME");
  dynamicgraph::PoolStorage::destroy();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(constructor) {
  BOOST_CHECK_EQUAL(CustomEntity::CLASS_NAME, "CustomEntity");

  dynamicgraph::Entity *entity =
      dynamicgraph::FactoryStorage::getInstance()->newEntity("CustomEntity",
                                                             "my-entity");
  BOOST_CHECK_EQUAL(entity->getName(), "my-entity");
  BOOST_CHECK_EQUAL(entity->Entity::getClassName(), "Entity");
  BOOST_CHECK_EQUAL(entity->getClassName(), CustomEntity::CLASS_NAME);

  // CustomEntity entity2 ("");
  // Deregister entities before destroying them
  dynamicgraph::PoolStorage::destroy();
}